

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2_p.h
# Opt level: O2

void __thiscall QGles2CommandBuffer::resetState(QGles2CommandBuffer *this)

{
  this->recordingPass = NoPass;
  this->passNeedsResourceTracking = true;
  this->currentTarget = (QRhiRenderTarget *)0x0;
  resetCommands(this);
  resetCachedState(this);
  return;
}

Assistant:

void resetState() {
        recordingPass = NoPass;
        passNeedsResourceTracking = true;
        // do not zero lastGpuTime
        currentTarget = nullptr;
        resetCommands();
        resetCachedState();
    }